

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_uniform_components_limit
               (NegativeTestContext *ctx)

{
  int iVar1;
  ostream *poVar2;
  RenderContext *renderCtx;
  ProgramSources *sources;
  allocator<char> local_561;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  ShaderSource local_4e0;
  ProgramSources local_4b8;
  undefined1 local_3e8 [8];
  ShaderProgram program;
  undefined1 local_308 [8];
  ostringstream shaderBody;
  ostringstream shaderDecl;
  int limit;
  NegativeTestContext *ctx_local;
  
  iVar1 = getResourceLimit(ctx,0x8263);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
  poVar2 = std::operator<<((ostream *)&shaderBody.field_0x170,"uniform highp uint u_value[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1 + 1);
  poVar2 = std::operator<<(poVar2,"];\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(binding = 0) buffer Output {\n");
  poVar2 = std::operator<<(poVar2,"    uint values[2];\n");
  std::operator<<(poVar2,"} sb_out;\n");
  poVar2 = std::operator<<((ostream *)local_308,"    sb_out.values[0] = u_value[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"];\n");
  std::operator<<((ostream *)local_308,"    sb_out.values[1] = u_value[0];\n");
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_4b8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateComputeShader(&local_500,ctx,&local_520,&local_540);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_4e0,&local_500);
  sources = glu::ProgramSources::operator<<(&local_4b8,&local_4e0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_3e8,renderCtx,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_520);
  glu::ProgramSources::~ProgramSources(&local_4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,
             "Link error is generated if compute shader exceeds GL_MAX_COMPUTE_UNIFORM_COMPONENTS.",
             &local_561);
  NegativeTestContext::beginSection(ctx,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  verifyLinkError(ctx,(ShaderProgram *)local_3e8);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_3e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderBody.field_0x170);
  return;
}

Assistant:

void exceed_uniform_components_limit (NegativeTestContext& ctx)
{
	const int			limit = getResourceLimit(ctx, GL_MAX_COMPUTE_UNIFORM_COMPONENTS);
	std::ostringstream	shaderDecl;
	std::ostringstream	shaderBody;

	shaderDecl	<< "uniform highp uint u_value[" << limit + 1 << "];\n"
				<< "\n"
				<< "layout(binding = 0) buffer Output {\n"
				<< "    uint values[2];\n"
				<< "} sb_out;\n";

	shaderBody << "    sb_out.values[0] = u_value[" << limit << "];\n";
	shaderBody << "    sb_out.values[1] = u_value[0];\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	ctx.beginSection("Link error is generated if compute shader exceeds GL_MAX_COMPUTE_UNIFORM_COMPONENTS.");
	verifyLinkError(ctx, program);
	ctx.endSection();
}